

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O2

void __thiscall
async::detail::threadpool_data::threadpool_data
          (threadpool_data *this,size_t num_threads,function<void_()> *prerun_,
          function<void_()> *postrun_)

{
  task_wait_event **pptVar1;
  
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  aligned_array<async::detail::thread_data_t,_64UL>::aligned_array(&this->thread_data,num_threads);
  fifo_queue::fifo_queue(&this->public_queue);
  this->shutdown = false;
  (this->num_waiters).super___atomic_base<unsigned_long>._M_i = 0;
  pptVar1 = (task_wait_event **)
            operator_new__(-(ulong)(num_threads >> 0x3d != 0) | num_threads << 3);
  (this->waiters)._M_t.
  super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
  .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl = pptVar1;
  std::function<void_()>::function(&this->prerun,prerun_);
  std::function<void_()>::function(&this->postrun,postrun_);
  return;
}

Assistant:

threadpool_data(std::size_t num_threads, std::function<void()>&& prerun_, std::function<void()>&& postrun_)
		: thread_data(num_threads), shutdown(false), num_waiters(0), waiters(new task_wait_event*[num_threads]),
          prerun(std::move(prerun_)), postrun(std::move(postrun_)) {}